

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  cmExternalMakefileProjectGenerator *extraGenerator;
  pointer pbVar4;
  int iVar5;
  pointer ppcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cmGlobalGenerator *this_01;
  undefined8 uVar7;
  pointer ppcVar8;
  string *globalGenerator;
  bool bVar9;
  string name;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  RegisteredGeneratorsVector *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string local_d0;
  uint local_ac;
  cmExternalMakefileProjectGenerator *local_a8;
  long *local_a0;
  long local_98;
  long local_90 [2];
  cmake *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pointer local_60;
  pointer local_58;
  string local_50;
  undefined4 extraout_var_01;
  
  ppcVar6 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (this->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = this;
  if (ppcVar6 != local_60) {
    uVar7 = 0;
    do {
      this_00 = *ppcVar6;
      local_58 = ppcVar6;
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_78,this_00);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_d0,this_00);
      local_ac = (uint)uVar7;
      if (local_d0._M_string_length == gname->_M_string_length) {
        if (local_d0._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar5 = bcmp(local_d0._M_dataplus._M_p,(gname->_M_dataplus)._M_p,local_d0._M_string_length
                      );
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      globalGenerator =
           local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (bVar9) {
        iVar5 = (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(this_00);
        if (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar7 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          _Unwind_Resume(uVar7);
        }
        local_a0 = local_90;
        pcVar1 = ((local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_a8 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var_00,iVar5);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar1,
                   pcVar1 + (local_78.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
LAB_00220463:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        if ((local_ac & 1) == 0) goto LAB_00220499;
        break;
      }
      for (; globalGenerator != pbVar4; globalGenerator = globalGenerator + 1) {
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,this_00);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  (&local_d0,globalGenerator,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_d0._M_string_length == gname->_M_string_length) {
          if (local_d0._M_string_length == 0) {
            bVar9 = true;
          }
          else {
            iVar5 = bcmp(local_d0._M_dataplus._M_p,(gname->_M_dataplus)._M_p,
                         local_d0._M_string_length);
            bVar9 = iVar5 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          iVar5 = (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(this_00);
          local_a8 = (cmExternalMakefileProjectGenerator *)CONCAT44(extraout_var,iVar5);
          local_a0 = local_90;
          pcVar1 = (globalGenerator->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar1,pcVar1 + globalGenerator->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (bVar9) goto LAB_00220463;
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      ppcVar6 = local_58 + 1;
      uVar7 = CONCAT71((int7)((ulong)pbVar4 >> 8),ppcVar6 == local_60);
    } while (ppcVar6 != local_60);
  }
  local_a8 = (cmExternalMakefileProjectGenerator *)0x0;
  local_a0 = local_90;
  pcVar1 = (gname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + gname->_M_string_length);
LAB_00220499:
  extraGenerator = local_a8;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_a0,local_98 + (long)local_a0);
  ppcVar2 = (local_80->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar3 = (local_80->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar2 == ppcVar3) {
    this_01 = (cmGlobalGenerator *)0x0;
  }
  else {
    do {
      ppcVar8 = ppcVar2 + 1;
      iVar5 = (*(*ppcVar2)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar2,&local_d0,local_80);
      this_01 = (cmGlobalGenerator *)CONCAT44(extraout_var_01,iVar5);
      if (this_01 != (cmGlobalGenerator *)0x0) break;
      ppcVar2 = ppcVar8;
    } while (ppcVar8 != ppcVar3);
  }
  if (this_01 == (cmGlobalGenerator *)0x0) {
    if (extraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
      (*extraGenerator->_vptr_cmExternalMakefileProjectGenerator[1])(extraGenerator);
    }
  }
  else {
    cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_01,extraGenerator);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return this_01;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = nullptr;
  for (cmGlobalGeneratorFactory* g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}